

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

ssize_t __thiscall Process::read(Process *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  fd_set *__arr;
  fd_set fdr;
  timeval tv;
  fd_set local_a8;
  timeval local_28;
  
  local_a8.fds_bits[0xe] = 0;
  local_a8.fds_bits[0xf] = 0;
  local_a8.fds_bits[0xc] = 0;
  local_a8.fds_bits[0xd] = 0;
  local_a8.fds_bits[10] = 0;
  local_a8.fds_bits[0xb] = 0;
  local_a8.fds_bits[8] = 0;
  local_a8.fds_bits[9] = 0;
  local_a8.fds_bits[6] = 0;
  local_a8.fds_bits[7] = 0;
  local_a8.fds_bits[4] = 0;
  local_a8.fds_bits[5] = 0;
  local_a8.fds_bits[2] = 0;
  local_a8.fds_bits[3] = 0;
  local_a8.fds_bits[0] = 0;
  local_a8.fds_bits[1] = 0;
  uVar1 = *(uint *)__nbytes;
  iVar2 = 0;
  if (((uVar1 & 1) != 0) && (iVar5 = this->fdStdOutRead, iVar2 = 0, iVar5 != 0)) {
    iVar2 = iVar5 + 0x3f;
    if (-1 < iVar5) {
      iVar2 = iVar5;
    }
    local_a8.fds_bits[iVar2 >> 6] =
         local_a8.fds_bits[iVar2 >> 6] | 1L << ((byte)(iVar5 % 0x40) & 0x3f);
    iVar2 = iVar5;
  }
  if (((uVar1 & 2) != 0) && (iVar5 = this->fdStdErrRead, iVar5 != 0)) {
    iVar4 = iVar5 + 0x3f;
    if (-1 < iVar5) {
      iVar4 = iVar5;
    }
    local_a8.fds_bits[iVar4 >> 6] = local_a8.fds_bits[iVar4 >> 6] | 1L << ((byte)iVar5 & 0x3f);
    if (iVar2 < iVar5) goto LAB_0010a864;
  }
  iVar5 = iVar2;
  if (iVar2 == 0) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    return -1;
  }
LAB_0010a864:
  local_28.tv_sec = 1000;
  local_28.tv_usec = 0;
  do {
    iVar2 = select(iVar5 + 1,&local_a8,(fd_set *)0x0,(fd_set *)0x0,&local_28);
  } while (iVar2 == 0);
  return -1;
}

Assistant:

ssize Process::read(void* buffer, usize length, uint& streams)
{
#ifdef _WIN32
  HANDLE handles[2];
  DWORD handleCount = 0;
  if(streams & stdoutStream && hStdOutRead != INVALID_HANDLE_VALUE)
    handles[handleCount++] = hStdOutRead;
  if(streams & stderrStream && hStdErrRead != INVALID_HANDLE_VALUE)
    handles[handleCount++] = hStdErrRead;
  if(handleCount == 0)
  {
    SetLastError(ERROR_INVALID_HANDLE);
    return -1;
  }
  DWORD dw = WaitForMultipleObjects(handleCount, handles, FALSE, INFINITE);
  if(dw < WAIT_OBJECT_0 || dw >= WAIT_OBJECT_0 + handleCount)
    return -1;
  HANDLE readHandle = handles[dw - WAIT_OBJECT_0];
  streams = readHandle == hStdOutRead ? stdoutStream : stderrStream;
  DWORD i;
#ifdef _AMD64
  byte* bufferStart = (byte*)buffer;
  while(length > (usize)INT_MAX)
  {
    if(!ReadFile(readHandle, buffer, INT_MAX, &i, NULL))
    {
      if(GetLastError() == ERROR_BROKEN_PIPE)
        return (byte*)buffer - bufferStart;
      return -1;
    }
    buffer = (byte*)buffer + i;
    if(i != INT_MAX)
      return (byte*)buffer - bufferStart;
    length -= INT_MAX;
  }
  if(!ReadFile(readHandle, buffer, (DWORD)length, &i, NULL))
  {
    if(GetLastError() == ERROR_BROKEN_PIPE)
      return (byte*)buffer - bufferStart;
    return -1;
  }
  buffer = (byte*)buffer + i;
  return (byte*)buffer - bufferStart;
#else
  if(!ReadFile(readHandle, buffer, length, &i, NULL))
    return -1;
  return i;
#endif
#else
  fd_set fdr;
  FD_ZERO(&fdr);
  int maxFd = 0;
  if(streams & stdoutStream && fdStdOutRead)
  {
    FD_SET(fdStdOutRead, &fdr);
    maxFd = fdStdOutRead;
  }
  if(streams & stderrStream && fdStdErrRead)
  {
    FD_SET(fdStdErrRead, &fdr);
    if(fdStdErrRead > maxFd)
      maxFd = fdStdErrRead;
  }
  if(maxFd == 0)
  {
    errno = EINVAL;
    return -1;
  }
  timeval tv = {1000, 0};
  for(;;)
  {
    int i;
    if((i = select(maxFd + 1, &fdr, 0, 0, &tv)) != 0)
      return -1;
    if(i == 0 || (i < 0 && errno == EINTR))
      continue;
  }
  if(streams & stdoutStream && fdStdOutRead && FD_ISSET(fdStdOutRead, &fdr))
  {
    streams = stdoutStream;
    return ::read(fdStdOutRead, buffer, length);
  }
  if(streams & stderrStream && fdStdErrRead && FD_ISSET(fdStdErrRead, &fdr))
  {
    streams = stderrStream;
    return ::read(fdStdErrRead, buffer, length);
  }
  return -1;
#endif
}